

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O3

int zisofs_init_zstream(archive_write *a)

{
  void *pvVar1;
  int iVar2;
  char *fmt;
  
  pvVar1 = a->format_data;
  *(undefined8 *)((long)pvVar1 + 0x248) = 0;
  *(undefined4 *)((long)pvVar1 + 0x250) = 0;
  *(undefined8 *)((long)pvVar1 + 600) = 0;
  *(undefined8 *)((long)pvVar1 + 0x270) = 0;
  if (*(int *)((long)pvVar1 + 0x2b8) == 0) {
    iVar2 = cm_zlib_deflateInit_
                      ((z_streamp)((long)pvVar1 + 0x248),*(int *)((long)pvVar1 + 0x2c8),"1.3.1",0x70
                      );
    *(undefined4 *)((long)pvVar1 + 0x2b8) = 1;
  }
  else {
    iVar2 = cm_zlib_deflateReset((z_streamp)((long)pvVar1 + 0x248));
  }
  if (iVar2 == -6) {
    fmt = "Internal error initializing compression library: invalid library version";
  }
  else {
    if (iVar2 == -4) {
      fmt = "Internal error initializing compression library";
      iVar2 = 0xc;
      goto LAB_006aa422;
    }
    if (iVar2 == 0) {
      return 0;
    }
    fmt = "Internal error initializing compression library: invalid setup parameter";
  }
  iVar2 = -1;
LAB_006aa422:
  archive_set_error(&a->archive,iVar2,fmt);
  return -0x1e;
}

Assistant:

static int
zisofs_init_zstream(struct archive_write *a)
{
	struct iso9660 *iso9660 = a->format_data;
	int r;

	iso9660->zisofs.stream.next_in = NULL;
	iso9660->zisofs.stream.avail_in = 0;
	iso9660->zisofs.stream.total_in = 0;
	iso9660->zisofs.stream.total_out = 0;
	if (iso9660->zisofs.stream_valid)
		r = deflateReset(&(iso9660->zisofs.stream));
	else {
		r = deflateInit(&(iso9660->zisofs.stream),
		    iso9660->zisofs.compression_level);
		iso9660->zisofs.stream_valid = 1;
	}
	switch (r) {
	case Z_OK:
		break;
	default:
	case Z_STREAM_ERROR:
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Internal error initializing "
		    "compression library: invalid setup parameter");
		return (ARCHIVE_FATAL);
	case Z_MEM_ERROR:
		archive_set_error(&a->archive, ENOMEM,
		    "Internal error initializing "
		    "compression library");
		return (ARCHIVE_FATAL);
	case Z_VERSION_ERROR:
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Internal error initializing "
		    "compression library: invalid library version");
		return (ARCHIVE_FATAL);
	}
	return (ARCHIVE_OK);
}